

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

Value __thiscall Frame::popTopOfOperandStack(Frame *this)

{
  Value VVar1;
  size_type sVar2;
  _Elt_pointer pVVar3;
  ostream *poVar4;
  
  sVar2 = std::deque<Value,_std::allocator<Value>_>::size(&(this->_operandStack).c);
  if (sVar2 != 0) {
    pVVar3 = (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pVVar3 == (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pVVar3 = (this->_operandStack).c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    VVar1 = pVVar3[-1];
    std::deque<Value,_std::allocator<Value>_>::pop_back(&(this->_operandStack).c);
    return VVar1;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"IndexOutOfBoundsException");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

Value Frame::popTopOfOperandStack() {
    if (_operandStack.size() == 0) {
        cerr << "IndexOutOfBoundsException" << endl;
        exit(1);
    }
    
    Value top = _operandStack.top();
    
    _operandStack.pop();
    return top;
}